

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3RenameTokenMap(Parse *pParse,void *pPtr,Token *pToken)

{
  undefined4 uVar1;
  RenameToken *pRVar2;
  RenameToken *pNew;
  Token *pToken_local;
  void *pPtr_local;
  Parse *pParse_local;
  
  pRVar2 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20);
  if (pRVar2 != (RenameToken *)0x0) {
    pRVar2->p = pPtr;
    (pRVar2->t).z = pToken->z;
    uVar1 = *(undefined4 *)&pToken->field_0xc;
    (pRVar2->t).n = pToken->n;
    *(undefined4 *)&(pRVar2->t).field_0xc = uVar1;
    pRVar2->pNext = pParse->pRename;
    pParse->pRename = pRVar2;
  }
  return pPtr;
}

Assistant:

SQLITE_PRIVATE void *sqlite3RenameTokenMap(Parse *pParse, void *pPtr, Token *pToken){
  RenameToken *pNew;
  assert( pPtr || pParse->db->mallocFailed );
  renameTokenCheckAll(pParse, pPtr);
  pNew = sqlite3DbMallocZero(pParse->db, sizeof(RenameToken));
  if( pNew ){
    pNew->p = pPtr;
    pNew->t = *pToken;
    pNew->pNext = pParse->pRename;
    pParse->pRename = pNew;
  }

  return pPtr;
}